

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O0

DecoderResult *
ZXing::Pdf417::ScanningDecoder::Decode
          (BitMatrix *image,Nullable<ZXing::ResultPoint> *imageTopLeft,
          Nullable<ZXing::ResultPoint> *imageBottomLeft,Nullable<ZXing::ResultPoint> *imageTopRight,
          Nullable<ZXing::ResultPoint> *imageBottomRight,int minCodewordWidth,int maxCodewordWidth)

{
  Codeword codeword_00;
  bool bVar1;
  int iVar2;
  int minColumn;
  int maxColumn;
  int iVar3;
  int iVar4;
  int iVar5;
  Nullable<ZXing::Pdf417::BoundingBox> *pNVar6;
  BoundingBox *this;
  Nullable<ZXing::Pdf417::DetectionResultColumn> *a;
  Nullable<ZXing::Pdf417::DetectionResultColumn> *this_00;
  DetectionResultColumn *pDVar7;
  Codeword *this_01;
  Nullable<ZXing::ResultPoint> *in_RDX;
  DetectionResult *in_RSI;
  DecoderResult *in_RDI;
  pointer in_R8;
  ResultPoint RVar8;
  undefined4 in_stack_00000008;
  undefined4 in_stack_00000010;
  Nullable<ZXing::Pdf417::Codeword> codeword;
  int imageRow;
  int previousStartColumn;
  int startColumn;
  RowIndicator rowIndicator;
  int barcodeColumn;
  int barcodeColumnCount;
  bool leftToRight;
  int maxBarcodeColumn;
  int i;
  DetectionResult detectionResult;
  Nullable<ZXing::Pdf417::DetectionResultColumn> rightRowIndicatorColumn;
  Nullable<ZXing::Pdf417::DetectionResultColumn> leftRowIndicatorColumn;
  BoundingBox boundingBox;
  undefined4 uVar9;
  DecoderResult *in_stack_fffffffffffff8a0;
  undefined4 uVar10;
  undefined4 in_stack_fffffffffffff8a8;
  int in_stack_fffffffffffff8ac;
  DetectionResult *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8b8;
  int in_stack_fffffffffffff8bc;
  int in_stack_fffffffffffff8c0;
  undefined4 in_stack_fffffffffffff8c4;
  undefined4 in_stack_fffffffffffff8c8;
  int iVar11;
  undefined4 in_stack_fffffffffffff8d0;
  undefined4 in_stack_fffffffffffff8d4;
  RowIndicator in_stack_fffffffffffff8e4;
  DetectionResult *in_stack_fffffffffffff8e8;
  undefined4 in_stack_fffffffffffff8f0;
  int in_stack_fffffffffffff8f4;
  BitMatrix *image_00;
  int imageRow_00;
  int in_stack_fffffffffffff930;
  int local_6cc;
  Nullable<ZXing::Pdf417::BoundingBox> *in_stack_fffffffffffff940;
  int in_stack_fffffffffffff948;
  int in_stack_fffffffffffff94c;
  int in_stack_fffffffffffff960;
  int in_stack_fffffffffffff964;
  undefined1 uVar12;
  BoundingBox *in_stack_fffffffffffff968;
  Nullable<ZXing::Pdf417::BoundingBox> *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  undefined8 in_stack_fffffffffffff990;
  DetectionResult *in_stack_fffffffffffff9a8;
  DetectionResultColumn *local_600;
  DecoderResult *pDStack_5f8;
  int in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  undefined4 in_stack_fffffffffffffa30;
  int iVar13;
  undefined4 in_stack_fffffffffffffa34;
  int iVar14;
  Nullable<ZXing::Pdf417::DetectionResultColumn> *in_stack_fffffffffffffa38;
  BitMatrix local_530 [5];
  int local_48c;
  int local_488;
  int local_484;
  byte local_47d;
  int local_47c;
  undefined1 local_478 [124];
  undefined4 local_3fc;
  double local_3f8;
  double local_3f0;
  double local_350;
  double local_348;
  int local_2a4;
  DetectionResult local_2a0 [2];
  Nullable<ZXing::Pdf417::DetectionResultColumn> local_148;
  undefined1 local_a8 [152];
  DetectionResult *local_10;
  
  local_a8._128_8_ = in_R8;
  local_a8._144_8_ = in_RDX;
  local_10 = in_RSI;
  BoundingBox::BoundingBox((BoundingBox *)in_stack_fffffffffffff8a0);
  BitMatrix::width((BitMatrix *)local_10);
  BitMatrix::height((BitMatrix *)local_10);
  pDVar7 = (DetectionResultColumn *)local_a8;
  bVar1 = BoundingBox::Create(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8bc,
                              (Nullable<ZXing::ResultPoint> *)in_stack_fffffffffffff8b0,
                              (Nullable<ZXing::ResultPoint> *)
                              CONCAT44(in_stack_fffffffffffff8ac,in_stack_fffffffffffff8a8),
                              (Nullable<ZXing::ResultPoint> *)in_stack_fffffffffffff8a0,
                              (Nullable<ZXing::ResultPoint> *)pDVar7,
                              (BoundingBox *)
                              CONCAT44(in_stack_fffffffffffff8d4,in_stack_fffffffffffff8d0));
  if (bVar1) {
    Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable
              ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)0x2cfc07);
    Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable
              ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)0x2cfc14);
    DetectionResult::DetectionResult(in_stack_fffffffffffff8b0);
    for (local_2a4 = 0; uVar12 = (undefined1)((uint)in_stack_fffffffffffff964 >> 0x18),
        local_2a4 < 2; local_2a4 = local_2a4 + 1) {
      bVar1 = ZXing::operator!=((Nullable<ZXing::ResultPoint> *)local_a8._144_8_,(nullptr_t)0x0);
      if (bVar1) {
        RVar8 = Nullable::operator_cast_to_ResultPoint
                          ((Nullable<ZXing::ResultPoint> *)
                           CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        local_348 = RVar8.super_PointF.y;
        local_350 = RVar8.super_PointF.x;
        pDVar7 = (DetectionResultColumn *)CONCAT44((int)((ulong)pDVar7 >> 0x20),in_stack_00000010);
        GetRowIndicatorColumn
                  ((BitMatrix *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
                   (BoundingBox *)in_stack_fffffffffffff970,(ResultPoint *)in_stack_fffffffffffff968
                   ,(bool)uVar12,in_stack_fffffffffffff960,(int)in_stack_fffffffffffff990);
        Nullable<ZXing::Pdf417::DetectionResultColumn>::operator=
                  ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0,
                   pDVar7);
        DetectionResultColumn::~DetectionResultColumn((DetectionResultColumn *)0x2cfd20);
      }
      bVar1 = ZXing::operator!=((Nullable<ZXing::ResultPoint> *)local_a8._128_8_,(nullptr_t)0x0);
      if (bVar1) {
        in_stack_fffffffffffff9a8 = local_10;
        RVar8 = Nullable::operator_cast_to_ResultPoint
                          ((Nullable<ZXing::ResultPoint> *)
                           CONCAT44(in_stack_fffffffffffff8bc,in_stack_fffffffffffff8b8));
        local_3f0 = RVar8.super_PointF.y;
        local_3f8 = RVar8.super_PointF.x;
        pDVar7 = (DetectionResultColumn *)CONCAT44((int)((ulong)pDVar7 >> 0x20),in_stack_00000010);
        GetRowIndicatorColumn
                  ((BitMatrix *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
                   (BoundingBox *)in_stack_fffffffffffff970,(ResultPoint *)in_stack_fffffffffffff968
                   ,(bool)uVar12,in_stack_fffffffffffff960,(int)in_stack_fffffffffffff990);
        Nullable<ZXing::Pdf417::DetectionResultColumn>::operator=
                  ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0,
                   pDVar7);
        DetectionResultColumn::~DetectionResultColumn((DetectionResultColumn *)0x2cfe4c);
      }
      bVar1 = Merge(in_stack_fffffffffffffa38,
                    (Nullable<ZXing::Pdf417::DetectionResultColumn> *)
                    CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                    (DetectionResult *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                   );
      if (!bVar1) {
        (in_RDI->_extra).super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        (in_RDI->_extra).super___shared_ptr<ZXing::CustomData,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (in_RDI->_error)._file = (char *)0x0;
        (in_RDI->_error)._line = 0;
        (in_RDI->_error)._type = None;
        *(undefined5 *)&(in_RDI->_error).field_0x2b = 0;
        (in_RDI->_error)._msg.field_2._M_allocated_capacity = 0;
        *(undefined8 *)((long)&(in_RDI->_error)._msg.field_2 + 8) = 0;
        *(undefined8 *)&(in_RDI->_error)._msg = 0;
        (in_RDI->_error)._msg._M_string_length = 0;
        *(undefined8 *)((long)&(in_RDI->_structuredAppend).id.field_2 + 8) = 0;
        in_RDI->_isMirrored = false;
        in_RDI->_readerInit = false;
        *(undefined6 *)&in_RDI->field_0x8a = 0;
        (in_RDI->_structuredAppend).id._M_string_length = 0;
        (in_RDI->_structuredAppend).id.field_2._M_allocated_capacity = 0;
        (in_RDI->_structuredAppend).index = 0;
        (in_RDI->_structuredAppend).count = 0;
        *(undefined8 *)&(in_RDI->_structuredAppend).id = 0;
        *(undefined8 *)((long)&(in_RDI->_ecLevel).field_2 + 8) = 0;
        in_RDI->_lineCount = 0;
        in_RDI->_versionNumber = 0;
        (in_RDI->_ecLevel)._M_string_length = 0;
        (in_RDI->_ecLevel).field_2._M_allocated_capacity = 0;
        (in_RDI->_content).symbology.code = '\0';
        (in_RDI->_content).symbology.modifier = '\0';
        (in_RDI->_content).symbology.eciModifierOffset = '\0';
        (in_RDI->_content).symbology.aiFlag = None;
        (in_RDI->_content).defaultCharset = Unknown;
        (in_RDI->_content).hasECI = false;
        *(undefined2 *)&(in_RDI->_content).field_0x36 = 0;
        *(undefined8 *)&in_RDI->_ecLevel = 0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (in_RDI->_content).encodings.
        super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (in_RDI->_content).bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        DecoderResult::DecoderResult(in_stack_fffffffffffff8a0);
        goto LAB_002d055f;
      }
      if (local_2a4 != 0) {
LAB_002d005c:
        DetectionResult::setBoundingBox
                  ((DetectionResult *)in_stack_fffffffffffff8a0,&pDVar7->_boundingBox);
        break;
      }
      pNVar6 = DetectionResult::getBoundingBox(local_2a0);
      in_stack_fffffffffffff97f = ZXing::operator!=(pNVar6,(nullptr_t)0x0);
      if (!(bool)in_stack_fffffffffffff97f) goto LAB_002d005c;
      in_stack_fffffffffffff970 = DetectionResult::getBoundingBox(local_2a0);
      in_stack_fffffffffffff968 =
           Nullable<ZXing::Pdf417::BoundingBox>::value(in_stack_fffffffffffff970);
      in_stack_fffffffffffff964 = BoundingBox::minY(in_stack_fffffffffffff968);
      in_stack_fffffffffffff960 = BoundingBox::minY((BoundingBox *)local_a8);
      if (in_stack_fffffffffffff960 <= in_stack_fffffffffffff964) {
        pNVar6 = DetectionResult::getBoundingBox(local_2a0);
        this = Nullable<ZXing::Pdf417::BoundingBox>::value(pNVar6);
        in_stack_fffffffffffff94c = BoundingBox::maxY(this);
        in_stack_fffffffffffff948 = BoundingBox::maxY((BoundingBox *)local_a8);
        if (in_stack_fffffffffffff94c <= in_stack_fffffffffffff948) goto LAB_002d005c;
      }
      in_stack_fffffffffffff940 = DetectionResult::getBoundingBox(local_2a0);
      Nullable::operator_cast_to_BoundingBox
                ((Nullable<ZXing::Pdf417::BoundingBox> *)
                 CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
      memcpy(local_a8,local_478,0x78);
    }
    iVar2 = DetectionResult::barcodeColumnCount((DetectionResult *)0x2d009a);
    local_47c = iVar2 + 1;
    DetectionResult::setColumn
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0);
    DetectionResult::setColumn
              (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
               (Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0);
    local_47d = ZXing::operator!=(&local_148,(nullptr_t)0x0);
    for (local_484 = 1; local_484 <= local_47c; local_484 = local_484 + 1) {
      if ((local_47d & 1) == 0) {
        local_6cc = local_47c - local_484;
      }
      else {
        local_6cc = local_484;
      }
      local_488 = local_6cc;
      a = DetectionResult::column
                    ((DetectionResult *)in_stack_fffffffffffff8a0,(int)((ulong)pDVar7 >> 0x20));
      bVar1 = ZXing::operator!=(a,(nullptr_t)0x0);
      if (!bVar1) {
        if (local_488 == 0) {
          imageRow_00 = 1;
        }
        else {
          imageRow_00 = 0;
          if (local_488 == local_47c) {
            imageRow_00 = 2;
          }
        }
        local_48c = imageRow_00;
        DetectionResultColumn::DetectionResultColumn
                  ((DetectionResultColumn *)
                   CONCAT44(in_stack_fffffffffffff8f4,in_stack_fffffffffffff8f0),
                   (BoundingBox *)in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e4);
        image_00 = local_530;
        Nullable<ZXing::Pdf417::DetectionResultColumn>::Nullable
                  ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0,
                   pDVar7);
        DetectionResult::setColumn
                  (in_stack_fffffffffffff8b0,in_stack_fffffffffffff8ac,
                   (Nullable<ZXing::Pdf417::DetectionResultColumn> *)in_stack_fffffffffffff8a0);
        Nullable<ZXing::Pdf417::DetectionResultColumn>::~Nullable
                  ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)0x2d026f);
        DetectionResultColumn::~DetectionResultColumn((DetectionResultColumn *)0x2d027c);
        iVar13 = -1;
        minColumn = BoundingBox::minY((BoundingBox *)local_a8);
        iVar5 = minColumn;
        while (iVar11 = iVar5, maxColumn = BoundingBox::maxY((BoundingBox *)local_a8),
              iVar5 <= maxColumn) {
          iVar3 = GetStartColumn((DetectionResult *)
                                 CONCAT44(in_stack_fffffffffffff94c,in_stack_fffffffffffff948),
                                 (int)((ulong)in_stack_fffffffffffff940 >> 0x20),
                                 (int)in_stack_fffffffffffff940,SUB41((uint)iVar2 >> 0x18,0));
          uVar12 = (undefined1)((uint)iVar5 >> 0x18);
          iVar5 = iVar3;
          if (((-1 < iVar3) &&
              (iVar14 = iVar3, iVar4 = BoundingBox::maxX((BoundingBox *)local_a8), iVar3 <= iVar4))
             || (iVar14 = iVar13, iVar13 != -1)) {
            uVar9 = (undefined4)((ulong)pDVar7 >> 0x20);
            uVar10 = (undefined4)((ulong)in_stack_fffffffffffff8a0 >> 0x20);
            in_stack_fffffffffffff8e8 = local_10;
            in_stack_fffffffffffff8f4 = BoundingBox::minX((BoundingBox *)local_a8);
            in_stack_fffffffffffff8e4 = BoundingBox::maxX((BoundingBox *)local_a8);
            in_stack_fffffffffffff8a0 = (DecoderResult *)CONCAT44(uVar10,in_stack_00000008);
            pDVar7 = (DetectionResultColumn *)CONCAT44(uVar9,iVar11);
            DetectCodeword(image_00,minColumn,maxColumn,(bool)uVar12,iVar5,imageRow_00,(int)a,
                           in_stack_fffffffffffff930);
            bVar1 = ZXing::operator!=((Nullable<ZXing::Pdf417::Codeword> *)&stack0xfffffffffffffa14,
                                      (nullptr_t)0x0);
            if (bVar1) {
              this_00 = DetectionResult::column
                                  ((DetectionResult *)in_stack_fffffffffffff8a0,
                                   (int)((ulong)pDVar7 >> 0x20));
              pDVar7 = Nullable<ZXing::Pdf417::DetectionResultColumn>::value(this_00);
              iVar13 = (int)pDVar7;
              iVar5 = iVar11;
              Nullable::operator_cast_to_Codeword
                        ((Nullable<ZXing::Pdf417::Codeword> *)
                         CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
              codeword_00._endX = in_stack_fffffffffffff8c4;
              codeword_00._startX = in_stack_fffffffffffff8c0;
              codeword_00._bucket = in_stack_fffffffffffff8c8;
              codeword_00._value = iVar11;
              codeword_00._rowNumber = iVar13;
              pDVar7 = local_600;
              in_stack_fffffffffffff8a0 = pDStack_5f8;
              iVar13 = iVar14;
              DetectionResultColumn::setCodeword
                        ((DetectionResultColumn *)in_stack_fffffffffffff8b0,
                         in_stack_fffffffffffff8ac,codeword_00);
              this_01 = Nullable<ZXing::Pdf417::Codeword>::value
                                  ((Nullable<ZXing::Pdf417::Codeword> *)&stack0xfffffffffffffa14);
              in_stack_fffffffffffff8c0 = (int)this_01;
              in_stack_fffffffffffff8c4 = (undefined4)((ulong)this_01 >> 0x20);
              Codeword::width(this_01);
              UpdateMinMax<int>((int *)in_stack_fffffffffffff8a0,(int *)pDVar7,0);
              iVar11 = iVar5;
            }
          }
          iVar5 = iVar11 + 1;
        }
      }
    }
    CreateDecoderResult(in_stack_fffffffffffff9a8);
LAB_002d055f:
    local_3fc = 1;
    DetectionResult::~DetectionResult((DetectionResult *)0x2d056c);
    Nullable<ZXing::Pdf417::DetectionResultColumn>::~Nullable
              ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)0x2d0579);
    Nullable<ZXing::Pdf417::DetectionResultColumn>::~Nullable
              ((Nullable<ZXing::Pdf417::DetectionResultColumn> *)0x2d0586);
  }
  else {
    memset(in_RDI,0,0xd0);
    DecoderResult::DecoderResult(in_stack_fffffffffffff8a0);
  }
  return in_RDI;
}

Assistant:

DecoderResult
ScanningDecoder::Decode(const BitMatrix& image, const Nullable<ResultPoint>& imageTopLeft, const Nullable<ResultPoint>& imageBottomLeft,
	const Nullable<ResultPoint>& imageTopRight, const Nullable<ResultPoint>& imageBottomRight,
	int minCodewordWidth, int maxCodewordWidth)
{
	BoundingBox boundingBox;
	if (!BoundingBox::Create(image.width(), image.height(), imageTopLeft, imageBottomLeft, imageTopRight, imageBottomRight, boundingBox)) {
		return {};
	}
	
	Nullable<DetectionResultColumn> leftRowIndicatorColumn, rightRowIndicatorColumn;
	DetectionResult detectionResult;
	for (int i = 0; i < 2; i++) {
		if (imageTopLeft != nullptr) {
			leftRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopLeft, true, minCodewordWidth, maxCodewordWidth);
		}
		if (imageTopRight != nullptr) {
			rightRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopRight, false, minCodewordWidth, maxCodewordWidth);
		}
		if (!Merge(leftRowIndicatorColumn, rightRowIndicatorColumn, detectionResult)) {
			return {};
		}
		if (i == 0 && detectionResult.getBoundingBox() != nullptr && (detectionResult.getBoundingBox().value().minY() < boundingBox.minY() || detectionResult.getBoundingBox().value().maxY() > boundingBox.maxY())) {
			boundingBox = detectionResult.getBoundingBox();
		}
		else {
			detectionResult.setBoundingBox(boundingBox);
			break;
		}
	}

	int maxBarcodeColumn = detectionResult.barcodeColumnCount() + 1;
	detectionResult.setColumn(0, leftRowIndicatorColumn);
	detectionResult.setColumn(maxBarcodeColumn, rightRowIndicatorColumn);

	bool leftToRight = leftRowIndicatorColumn != nullptr;
	for (int barcodeColumnCount = 1; barcodeColumnCount <= maxBarcodeColumn; barcodeColumnCount++) {
		int barcodeColumn = leftToRight ? barcodeColumnCount : maxBarcodeColumn - barcodeColumnCount;
		if (detectionResult.column(barcodeColumn) != nullptr) {
			// This will be the case for the opposite row indicator column, which doesn't need to be decoded again.
			continue;
		}
		DetectionResultColumn::RowIndicator rowIndicator = barcodeColumn == 0 ? DetectionResultColumn::RowIndicator::Left : (barcodeColumn == maxBarcodeColumn ? DetectionResultColumn::RowIndicator::Right : DetectionResultColumn::RowIndicator::None);
		detectionResult.setColumn(barcodeColumn, DetectionResultColumn(boundingBox, rowIndicator));
		int startColumn = -1;
		int previousStartColumn = startColumn;
		// TODO start at a row for which we know the start position, then detect upwards and downwards from there.
		for (int imageRow = boundingBox.minY(); imageRow <= boundingBox.maxY(); imageRow++) {
			startColumn = GetStartColumn(detectionResult, barcodeColumn, imageRow, leftToRight);
			if (startColumn < 0 || startColumn > boundingBox.maxX()) {
				if (previousStartColumn == -1) {
					continue;
				}
				startColumn = previousStartColumn;
			}
			Nullable<Codeword> codeword = DetectCodeword(image, boundingBox.minX(), boundingBox.maxX(), leftToRight, startColumn, imageRow, minCodewordWidth, maxCodewordWidth);
			if (codeword != nullptr) {
				detectionResult.column(barcodeColumn).value().setCodeword(imageRow, codeword);
				previousStartColumn = startColumn;
				UpdateMinMax(minCodewordWidth, maxCodewordWidth, codeword.value().width());
			}
		}
	}
	return CreateDecoderResult(detectionResult);
}